

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O0

void embree::ISPCScene::updateLight<embree::SceneGraph::DistantLight>(DistantLight *in,Light *out)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined8 *puVar10;
  long in_RDI;
  float fVar11;
  __m128 mask;
  __m128 r_1;
  __m128 a_2;
  __m128 c_1;
  __m128 r;
  __m128 a_1;
  vfloat4 c;
  vfloat4 b;
  vfloat4 a;
  undefined8 local_778;
  undefined8 uStackY_770;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_768;
  ulong local_758;
  ulong uStackY_750;
  Vec3fa *radiance;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *direction;
  ulong *super;
  undefined8 local_708;
  undefined8 uStack_700;
  float local_6ec;
  undefined8 *local_6e8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  float local_6bc;
  undefined8 *local_6b8;
  undefined8 *local_6b0;
  undefined1 local_6a8 [16];
  ulong local_698;
  undefined8 uStack_690;
  float local_67c;
  undefined8 local_678;
  Vec3fa *pVStack_670;
  undefined4 local_65c;
  undefined8 local_658;
  Vec3fa *pVStack_650;
  ulong local_648;
  ulong uStack_640;
  ulong local_638;
  ulong uStack_630;
  ulong *local_620;
  undefined8 local_618;
  Vec3fa *pVStack_610;
  undefined4 local_608;
  undefined4 local_604;
  undefined4 local_600;
  undefined4 local_5fc;
  ulong local_5f8;
  undefined8 uStack_5f0;
  undefined1 local_5e8 [16];
  ulong local_5d8;
  undefined8 uStack_5d0;
  float local_5bc;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 *local_5a8;
  undefined8 *local_5a0;
  undefined1 local_598 [16];
  undefined4 local_57c;
  undefined1 local_578 [16];
  undefined4 local_55c;
  undefined1 local_558 [16];
  float local_53c;
  undefined1 local_538 [16];
  undefined4 local_51c;
  undefined1 local_518 [16];
  float local_4fc;
  ulong local_4f8;
  undefined8 uStack_4f0;
  ulong local_4e8;
  undefined8 uStack_4e0;
  ulong local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  ulong local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  ulong local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  ulong local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  ulong local_438;
  undefined8 uStack_430;
  ulong local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  ulong local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  ulong local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 *local_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 *local_350;
  undefined8 *local_348;
  undefined8 *local_340;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined8 *local_328;
  undefined8 *local_320;
  undefined8 *local_318;
  undefined8 *local_310;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  undefined8 *local_2f8;
  undefined8 *local_2f0;
  undefined8 *local_2e8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_2e0;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 *local_2a8;
  undefined8 *local_2a0;
  undefined8 *local_298;
  undefined8 *local_290;
  undefined8 *local_288;
  undefined8 *local_280;
  undefined8 *local_278;
  undefined8 *local_270;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  undefined8 *local_258;
  undefined8 *local_250;
  undefined8 *local_248;
  undefined8 *local_240;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined8 *local_228;
  undefined8 *local_220;
  undefined8 *local_218;
  undefined8 *local_210;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 *local_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 *local_1c0;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  undefined8 *local_1a8;
  undefined8 *local_1a0;
  undefined8 *local_198;
  undefined8 *local_190;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 *local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 *local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  float local_94;
  undefined8 *local_90;
  float local_84;
  undefined8 *local_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  ulong local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  ulong local_18;
  undefined8 uStack_10;
  
  local_6e8 = (undefined8 *)(in_RDI + 0x10);
  direction = &local_768;
  local_370 = &local_5b8;
  uVar1 = *local_6e8;
  uVar2 = *(undefined8 *)(in_RDI + 0x18);
  uVar3 = *local_6e8;
  uVar4 = *(undefined8 *)(in_RDI + 0x18);
  local_a8._0_4_ = (float)uVar1;
  local_a8._4_4_ = (float)((ulong)uVar1 >> 0x20);
  uStack_a0._0_4_ = (float)uVar2;
  uStack_a0._4_4_ = (float)((ulong)uVar2 >> 0x20);
  local_b8._0_4_ = (float)uVar3;
  local_b8._4_4_ = (float)((ulong)uVar3 >> 0x20);
  uStack_b0._0_4_ = (float)uVar4;
  uStack_b0._4_4_ = (float)((ulong)uVar4 >> 0x20);
  local_338 = (float)local_a8 * (float)local_b8;
  fStack_334 = local_a8._4_4_ * local_b8._4_4_;
  fStack_330 = (float)uStack_a0 * (float)uStack_b0;
  fStack_32c = uStack_a0._4_4_ * uStack_b0._4_4_;
  local_2b8 = CONCAT44(fStack_334,local_338);
  uStack_2b0 = CONCAT44(fStack_32c,fStack_330);
  local_2a8 = &local_388;
  local_298 = &local_398;
  local_1f8 = CONCAT44(fStack_334,fStack_334);
  uStack_1f0 = CONCAT44(fStack_334,fStack_334);
  local_288 = &local_3a8;
  local_178 = CONCAT44(fStack_330,fStack_330);
  uStack_170 = CONCAT44(fStack_330,fStack_330);
  local_278 = &local_3c8;
  local_238 = local_338 + fStack_334;
  fStack_234 = fStack_334 + fStack_334;
  fStack_230 = fStack_330 + fStack_334;
  fStack_22c = fStack_32c + fStack_334;
  local_108 = CONCAT44(fStack_234,local_238);
  uStack_100 = CONCAT44(fStack_22c,fStack_230);
  local_270 = &local_3b8;
  local_5bc = local_238 + fStack_330;
  fStack_264 = fStack_234 + fStack_330;
  fStack_260 = fStack_230 + fStack_330;
  fStack_25c = fStack_22c + fStack_330;
  local_368 = CONCAT44(fStack_264,local_5bc);
  uStack_360 = CONCAT44(fStack_25c,fStack_260);
  local_558 = ZEXT416((uint)local_5bc);
  local_5d8 = CONCAT44(0,local_5bc);
  uStack_5d0 = 0;
  uStack_4f0 = 0;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_5d8;
  local_5e8 = rsqrtss(auVar7,auVar7);
  local_55c = 0x3fc00000;
  local_578 = ZEXT416(0x3fc00000);
  local_448 = local_5e8._0_8_;
  uVar9 = local_448;
  uStack_440 = local_5e8._8_8_;
  local_448._0_4_ = local_5e8._0_4_;
  local_438 = (ulong)(uint)((float)local_448 * 1.5);
  uStack_430 = 0;
  local_57c = 0xbf000000;
  local_598 = ZEXT416(0xbf000000);
  local_468 = local_598._0_8_;
  uStack_460 = 0;
  local_458 = (ulong)(uint)(local_5bc * -0.5);
  uStack_450 = 0;
  local_488 = local_5e8._0_8_;
  uStack_480 = local_5e8._8_8_;
  local_6ec = local_5bc * -0.5 * (float)local_448;
  local_478 = (ulong)(uint)local_6ec;
  uStack_470 = 0;
  local_4a8 = local_5e8._0_8_;
  uStack_4a0 = local_5e8._8_8_;
  local_498 = CONCAT44(local_5e8._4_4_,(float)local_448 * (float)local_448);
  local_4c8 = local_498;
  local_6ec = local_6ec * (float)local_448 * (float)local_448;
  local_4b8 = (ulong)(uint)local_6ec;
  uStack_4b0 = 0;
  local_4e8 = local_4b8;
  uStack_4e0 = 0;
  local_6ec = (float)local_448 * 1.5 + local_6ec;
  local_4d8 = (ulong)(uint)local_6ec;
  uStack_4d0 = 0;
  local_5f8 = local_4d8;
  uStack_5f0 = 0;
  local_3e8 = local_4d8;
  uStack_3e0 = 0;
  local_2f0 = &local_708;
  local_f8 = CONCAT44(local_6ec,local_6ec);
  uStack_f0 = CONCAT44(local_6ec,local_6ec);
  uVar5 = *local_6e8;
  uVar6 = *(undefined8 *)(in_RDI + 0x18);
  local_e8._0_4_ = (float)uVar5;
  local_e8._4_4_ = (float)((ulong)uVar5 >> 0x20);
  uStack_e0._0_4_ = (float)uVar6;
  uStack_e0._4_4_ = (float)((ulong)uVar6 >> 0x20);
  local_2d8 = (float)local_e8 * local_6ec;
  fStack_2d4 = local_e8._4_4_ * local_6ec;
  fStack_2d0 = (float)uStack_e0 * local_6ec;
  fStack_2cc = uStack_e0._4_4_ * local_6ec;
  local_648 = CONCAT44(fStack_2d4,local_2d8);
  uStack_640 = CONCAT44(fStack_2cc,fStack_2d0);
  super = &local_758;
  local_65c = 0x80000000;
  local_5fc = 0x80000000;
  local_600 = 0x80000000;
  local_604 = 0x80000000;
  local_608 = 0x80000000;
  local_678 = 0x8000000080000000;
  radiance = (Vec3fa *)0x8000000080000000;
  local_638 = local_648 ^ 0x8000000080000000;
  uStack_630 = uStack_640 ^ 0x8000000080000000;
  puVar10 = (undefined8 *)(in_RDI + 0x20);
  local_6e0 = direction;
  pVStack_670 = radiance;
  local_658 = local_678;
  pVStack_650 = radiance;
  local_620 = super;
  local_618 = local_678;
  pVStack_610 = radiance;
  local_5a8 = local_6e8;
  local_5a0 = local_6e8;
  local_53c = local_5bc;
  local_4f8 = local_5d8;
  uStack_4c0 = local_5e8._8_8_;
  uStack_490 = local_5e8._8_8_;
  local_448 = uVar9;
  local_350 = local_6e8;
  local_348 = local_6e8;
  local_340 = local_370;
  local_328 = local_370;
  local_2e8 = local_6e8;
  local_2e0 = direction;
  local_2c0 = direction;
  local_2a0 = local_2a8;
  local_290 = local_2a8;
  local_280 = local_288;
  local_268 = local_5bc;
  local_258 = local_270;
  local_250 = local_298;
  local_248 = local_2a8;
  local_240 = local_278;
  local_228 = local_278;
  local_220 = local_270;
  local_218 = local_2a8;
  local_210 = local_298;
  local_208 = fStack_334;
  fStack_204 = fStack_334;
  fStack_200 = fStack_334;
  fStack_1fc = fStack_334;
  local_1e0 = local_298;
  local_1d8 = local_2b8;
  uStack_1d0 = uStack_2b0;
  local_1c0 = local_2a8;
  local_1b8 = local_298;
  local_1b0 = local_2a8;
  local_1a8 = local_288;
  local_1a0 = local_278;
  local_198 = local_2a8;
  local_190 = local_288;
  local_188 = fStack_330;
  fStack_184 = fStack_330;
  fStack_180 = fStack_330;
  fStack_17c = fStack_330;
  local_160 = local_288;
  local_158 = local_2b8;
  uStack_150 = uStack_2b0;
  local_140 = local_2a8;
  local_138 = local_1f8;
  uStack_130 = uStack_1f0;
  local_128 = local_2b8;
  uStack_120 = uStack_2b0;
  local_118 = local_178;
  uStack_110 = uStack_170;
  local_e8 = uVar5;
  uStack_e0 = uVar6;
  local_b8 = uVar3;
  uStack_b0 = uVar4;
  local_a8 = uVar1;
  uStack_a0 = uVar2;
  local_84 = local_6ec;
  local_80 = local_2f0;
  local_78 = local_6ec;
  fStack_74 = local_6ec;
  fStack_70 = local_6ec;
  fStack_6c = local_6ec;
  local_5c = local_6ec;
  local_768._0_8_ = local_648;
  local_768._8_8_ = uStack_640;
  local_758 = local_638;
  uStackY_750 = uStack_630;
  local_708 = local_f8;
  uStack_700 = uStack_f0;
  local_5b8 = local_2b8;
  uStack_5b0 = uStack_2b0;
  local_3c8 = local_108;
  uStack_3c0 = uStack_100;
  local_3b8 = local_368;
  uStack_3b0 = uStack_360;
  local_3a8 = local_178;
  uStack_3a0 = uStack_170;
  local_398 = local_1f8;
  uStack_390 = uStack_1f0;
  local_388 = local_2b8;
  uStack_380 = uStack_2b0;
  local_67c = uniformSampleConePDF(*(float *)(in_RDI + 0x38));
  local_518._4_4_ = 0;
  local_518._0_4_ = local_67c;
  local_698 = local_518._0_8_;
  uStack_690 = 0;
  local_38 = local_518._0_8_;
  uStack_30 = 0;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_518._0_8_;
  local_6a8 = rcpss(auVar8,auVar8);
  local_51c = 0x40000000;
  local_538 = ZEXT416(0x40000000);
  local_408 = local_518._0_8_;
  uStack_400 = 0;
  local_3f8._0_4_ = local_6a8._0_4_;
  local_6bc = (float)local_3f8;
  local_3f8._4_4_ = local_6a8._4_4_;
  local_3f8._0_4_ = (float)local_3f8 * local_67c;
  uStack_410 = local_6a8._8_8_;
  local_28 = local_3f8;
  fVar11 = 2.0 - (float)local_3f8;
  local_18 = (ulong)(uint)fVar11;
  uStack_10 = 0;
  local_428 = local_18;
  uStack_420 = 0;
  local_6bc = local_6bc * fVar11;
  local_418 = CONCAT44(local_3f8._4_4_,local_6bc);
  local_3d8 = local_418;
  local_6b0 = &local_778;
  local_90 = &local_6d8;
  local_d8 = CONCAT44(local_6bc,local_6bc);
  uStack_d0 = CONCAT44(local_6bc,local_6bc);
  local_310 = &local_778;
  local_320 = &local_6d8;
  uVar1 = *puVar10;
  uVar2 = *(undefined8 *)(in_RDI + 0x28);
  local_c8._0_4_ = (float)uVar1;
  local_c8._4_4_ = (float)((ulong)uVar1 >> 0x20);
  uStack_c0._0_4_ = (float)uVar2;
  uStack_c0._4_4_ = (float)((ulong)uVar2 >> 0x20);
  local_308 = (float)local_c8 * local_6bc;
  fStack_304 = local_c8._4_4_ * local_6bc;
  fStack_300 = (float)uStack_c0 * local_6bc;
  fStack_2fc = uStack_c0._4_4_ * local_6bc;
  local_2f8 = &local_778;
  local_778 = CONCAT44(fStack_304,local_308);
  uStackY_770 = CONCAT44(fStack_2fc,fStack_300);
  local_6b8 = puVar10;
  local_518 = ZEXT416((uint)local_67c);
  local_4fc = local_67c;
  uStack_3f0 = uStack_410;
  uStack_3d0 = uStack_410;
  local_318 = puVar10;
  local_c8 = uVar1;
  uStack_c0 = uVar2;
  local_94 = local_6bc;
  local_58 = local_6bc;
  fStack_54 = local_6bc;
  fStack_50 = local_6bc;
  fStack_4c = local_6bc;
  local_48 = local_6bc;
  uStack_20 = uStack_410;
  local_6d8 = local_d8;
  uStack_6d0 = uStack_d0;
  DirectionalLight_set(super,(Vec3fa *)&direction->field_1,radiance,-0.0);
  return;
}

Assistant:

void ISPCScene::updateLight(const SceneGraph::DistantLight& in, Light* out)
  {
    DirectionalLight_set(out,
                         -normalize(in.D),
                         in.L * rcp(uniformSampleConePDF(in.cosHalfAngle)),
                         in.cosHalfAngle);
  }